

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::rowsInserted(QTreeView *this,QModelIndex *parent,int start,int end)

{
  QPersistentModelIndex *rhs;
  QTreeViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  pointer pQVar6;
  QWidget *this_01;
  int iVar7;
  
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if ((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == false) {
    if (parent->c != 0) {
      bVar2 = QModelIndex::isValid(parent);
      if (bVar2) goto LAB_00546e0b;
    }
    pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
    iVar4 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,parent);
    iVar7 = (end - start) + 1;
    rhs = &(this_00->super_QAbstractItemViewPrivate).root;
    bVar2 = ::operator!=(parent,rhs);
    if (bVar2) {
      bVar2 = QTreeViewPrivate::isIndexExpanded(this_00,parent);
      if ((!bVar2) && (iVar7 < iVar4)) goto LAB_00546e0b;
    }
    iVar5 = QTreeViewPrivate::viewIndex(this_00,parent);
    if ((iVar5 == -1) || (((this_00->viewItems).d.ptr[iVar5].field_0x1c & 1) == 0)) {
      cVar3 = ::comparesEqual(rhs,parent);
      if (cVar3 == '\0') {
        if ((iVar5 != -1) && (iVar4 == iVar7)) {
          pQVar6 = QList<QTreeViewItem>::data(&this_00->viewItems);
          pQVar6[iVar5].field_0x1c = pQVar6[iVar5].field_0x1c | 4;
          this_01 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
          QWidget::update(this_01);
        }
        goto LAB_00546e0b;
      }
    }
    QAbstractItemViewPrivate::doDelayedItemsLayout(&this_00->super_QAbstractItemViewPrivate,0);
  }
LAB_00546e0b:
  QAbstractItemView::rowsInserted((QAbstractItemView *)this,parent,start,end);
  return;
}

Assistant:

void QTreeView::rowsInserted(const QModelIndex &parent, int start, int end)
{
    Q_D(QTreeView);
    // if we are going to do a complete relayout anyway, there is no need to update
    if (d->delayedPendingLayout) {
        QAbstractItemView::rowsInserted(parent, start, end);
        return;
    }

    //don't add a hierarchy on a column != 0
    if (parent.column() != 0 && parent.isValid()) {
        QAbstractItemView::rowsInserted(parent, start, end);
        return;
    }

    const int parentRowCount = d->model->rowCount(parent);
    const int delta = end - start + 1;
    if (parent != d->root && !d->isIndexExpanded(parent) && parentRowCount > delta) {
        QAbstractItemView::rowsInserted(parent, start, end);
        return;
    }

    const int parentItem = d->viewIndex(parent);
    if (((parentItem != -1) && d->viewItems.at(parentItem).expanded)
        || (parent == d->root)) {
        d->doDelayedItemsLayout();
    } else if (parentItem != -1 && parentRowCount == delta) {
        // the parent just went from 0 children to more. update to re-paint the decoration
        d->viewItems[parentItem].hasChildren = true;
        viewport()->update();
    }
    QAbstractItemView::rowsInserted(parent, start, end);
}